

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O1

void __thiscall FC_BPNN::setLearningStep(FC_BPNN *this,double a)

{
  pointer pmVar1;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  
  pmVar1 = (this->net).
           super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->net).
                super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 4) * -0x5555555555555555;
    lVar4 = 0;
    do {
      for (p_Var3 = *(_Base_ptr *)((long)&pmVar1[lVar4]._M_t._M_impl.super__Rb_tree_header + 0x10);
          p_Var3 != &pmVar1[lVar4]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        *(double *)(p_Var3[1]._M_parent + 3) = a;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar2 + (ulong)(lVar2 == 0));
  }
  return;
}

Assistant:

void FC_BPNN::setLearningStep(double a)
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			element.second->learning_step = a;
		}
	}
}